

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O3

int main(void)

{
  int iVar1;
  ostream *this;
  long *plVar2;
  Token *__value;
  ulong uVar3;
  shared_ptr<IElement> tree;
  vector<Token,_std::allocator<Token>_> res;
  string input;
  undefined1 local_88 [24];
  long local_70;
  long *local_60;
  long local_58;
  long local_50 [2];
  string local_40;
  
  local_60 = local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"(13 - 4) - (12 + 1)","");
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_40,local_60,(long)local_60 + local_58);
  lex((vector<Token,_std::allocator<Token>_> *)(local_88 + 0x10),&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  local_88._0_8_ = &std::cout;
  local_88._8_8_ = " ";
  if (0 < local_70 - local_88._16_8_) {
    uVar3 = (ulong)(local_70 - local_88._16_8_) / 0x28 + 1;
    __value = (Token *)local_88._16_8_;
    do {
      std::ostream_iterator<Token,_char,_std::char_traits<char>_>::operator=
                ((ostream_iterator<Token,_char,_std::char_traits<char>_> *)local_88,__value);
      __value = __value + 1;
      uVar3 = uVar3 - 1;
    } while (1 < uVar3);
  }
  parse((vector<Token,_std::allocator<Token>_> *)local_88);
  this = std::__ostream_insert<char,std::char_traits<char>>
                   ((ostream *)&std::cout,(char *)local_60,local_58);
  std::__ostream_insert<char,std::char_traits<char>>(this," = ",3);
  iVar1 = (*(code *)**(undefined8 **)local_88._0_8_)();
  plVar2 = (long *)std::ostream::operator<<((ostream *)this,iVar1);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  if ((pointer)local_88._8_8_ != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
  }
  std::vector<Token,_std::allocator<Token>_>::~vector
            ((vector<Token,_std::allocator<Token>_> *)(local_88 + 0x10));
  if (local_60 != local_50) {
    operator_delete(local_60,local_50[0] + 1);
  }
  return 0;
}

Assistant:

int main()
{
	std::string input{"(13 - 4) - (12 + 1)"};
	auto res{lex(input)};
	std::copy(res.cbegin(), res.cend(), std::ostream_iterator<decltype(res)::value_type>(std::cout, " "));
	auto tree{parse(res)};
	std::cout << input << " = " << tree->eval() << std::endl;

	return 0;
}